

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-parser.c
# Opt level: O0

bc_trie_t * blogc_source_parse(char *src,size_t src_len,int toctree_maxdepth,bc_error_t **err)

{
  bc_trie_t *pbVar1;
  int iVar2;
  bc_error_t *pbVar3;
  char *pcVar4;
  void *pvVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  char *local_f8;
  bc_slist_t **local_e8;
  char *toctree;
  char *endptr;
  char *maxdepth;
  bc_slist_t *pbStack_90;
  _Bool read_headers;
  bc_slist_t *headers;
  char *endl;
  char *description;
  char *first_header;
  char c;
  bc_trie_t *pbStack_68;
  blogc_source_parser_state_t state;
  bc_trie_t *rv;
  char *content;
  char *tmp;
  char *key;
  size_t end_excerpt;
  size_t start;
  size_t current;
  bc_error_t **err_local;
  size_t sStack_20;
  int toctree_maxdepth_local;
  size_t src_len_local;
  char *src_local;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    src_local = (char *)0x0;
  }
  else {
    start = 0;
    end_excerpt = 0;
    key = (char *)0x0;
    tmp = (char *)0x0;
    content = (char *)0x0;
    rv = (bc_trie_t *)0x0;
    current = (size_t)err;
    err_local._4_4_ = toctree_maxdepth;
    sStack_20 = src_len;
    src_len_local = (size_t)src;
    pbStack_68 = bc_trie_new(free);
    first_header._4_4_ = 1;
    for (; pcVar7 = tmp, pbVar1 = pbStack_68, start < sStack_20; start = start + 1) {
      first_header._3_1_ = *(char *)(src_len_local + start);
      switch(first_header._4_4_) {
      case 1:
        if ((((first_header._3_1_ != ' ') && (first_header._3_1_ != '\t')) &&
            (first_header._3_1_ != '\n')) && (first_header._3_1_ != '\r')) {
          if ((first_header._3_1_ < 'A') || ('Z' < first_header._3_1_)) {
            if (first_header._3_1_ == '-') {
              first_header._4_4_ = 5;
            }
            else {
              pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,
                                       start,
                                       "Can\'t find a configuration key or the content separator.");
              *(bc_error_t **)current = pbVar3;
            }
          }
          else {
            first_header._4_4_ = 2;
            end_excerpt = start;
          }
        }
        break;
      case 2:
        if ((((first_header._3_1_ < 'A') || ('Z' < first_header._3_1_)) &&
            ((first_header._3_1_ < '0' || ('9' < first_header._3_1_)))) &&
           (first_header._3_1_ != '_')) {
          if (first_header._3_1_ == ':') {
            tmp = bc_strndup((char *)(src_len_local + end_excerpt),start - end_excerpt);
            if (((((start - end_excerpt == 8) &&
                  (iVar2 = strncmp("FILENAME",(char *)(src_len_local + end_excerpt),8), iVar2 == 0))
                 || (((start - end_excerpt == 7 &&
                      (iVar2 = strncmp("CONTENT",(char *)(src_len_local + end_excerpt),7),
                      iVar2 == 0)) ||
                     ((start - end_excerpt == 0xe &&
                      (iVar2 = strncmp("DATE_FORMATTED",(char *)(src_len_local + end_excerpt),0xe),
                      iVar2 == 0)))))) ||
                ((((start - end_excerpt == 0x14 &&
                   (iVar2 = strncmp("DATE_FIRST_FORMATTED",(char *)(src_len_local + end_excerpt),
                                    0x14), iVar2 == 0)) ||
                  (((start - end_excerpt == 0x13 &&
                    (iVar2 = strncmp("DATE_LAST_FORMATTED",(char *)(src_len_local + end_excerpt),
                                     0x13), iVar2 == 0)) ||
                   ((start - end_excerpt == 10 &&
                    (iVar2 = strncmp("PAGE_FIRST",(char *)(src_len_local + end_excerpt),10),
                    iVar2 == 0)))))) ||
                 ((start - end_excerpt == 0xd &&
                  (iVar2 = strncmp("PAGE_PREVIOUS",(char *)(src_len_local + end_excerpt),0xd),
                  iVar2 == 0)))))) ||
               (((start - end_excerpt == 0xc &&
                 (iVar2 = strncmp("PAGE_CURRENT",(char *)(src_len_local + end_excerpt),0xc),
                 iVar2 == 0)) ||
                ((((start - end_excerpt == 9 &&
                   (iVar2 = strncmp("PAGE_NEXT",(char *)(src_len_local + end_excerpt),9), iVar2 == 0
                   )) || ((start - end_excerpt == 9 &&
                          (iVar2 = strncmp("PAGE_LAST",(char *)(src_len_local + end_excerpt),9),
                          iVar2 == 0)))) ||
                 ((start - end_excerpt == 0xd &&
                  (iVar2 = strncmp("BLOGC_VERSION",(char *)(src_len_local + end_excerpt),0xd),
                  iVar2 == 0)))))))) {
              pbVar3 = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                                           "\'%s\' variable is forbidden in source files. It will be set for you by the compiler."
                                           ,tmp);
              *(bc_error_t **)current = pbVar3;
            }
            else {
              first_header._4_4_ = 3;
            }
          }
          else {
            pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,start
                                     ,"Invalid configuration key.");
            *(bc_error_t **)current = pbVar3;
          }
        }
        break;
      case 3:
        if ((first_header._3_1_ == '\n') || (first_header._3_1_ == '\r')) {
          pcVar4 = bc_strdup("");
          bc_trie_insert(pbVar1,pcVar7,pcVar4);
          free(tmp);
          tmp = (char *)0x0;
          first_header._4_4_ = 1;
        }
        else {
          first_header._4_4_ = 4;
          end_excerpt = start;
        }
        break;
      case 4:
        if ((first_header._3_1_ == '\n') || (first_header._3_1_ == '\r')) {
          content = bc_strndup((char *)(src_len_local + end_excerpt),start - end_excerpt);
          pcVar7 = tmp;
          pbVar1 = pbStack_68;
          pcVar4 = bc_str_strip(content);
          pcVar4 = bc_strdup(pcVar4);
          bc_trie_insert(pbVar1,pcVar7,pcVar4);
          free(content);
          free(tmp);
          tmp = (char *)0x0;
          first_header._4_4_ = 1;
        }
        break;
      case 5:
        if (first_header._3_1_ != '-') {
          if ((first_header._3_1_ == '\n') || (first_header._3_1_ == '\r')) {
            first_header._4_4_ = 6;
          }
          else {
            pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,start
                                     ,
                                     "Invalid content separator. Must be more than one \'-\' characters."
                                    );
            *(bc_error_t **)current = pbVar3;
          }
        }
        break;
      case 6:
        if ((first_header._3_1_ != '\n') && (first_header._3_1_ != '\r')) {
          end_excerpt = start;
          first_header._4_4_ = 7;
        }
        break;
      case 7:
        if (start == sStack_20 - 1) {
          content = bc_strndup((char *)(src_len_local + end_excerpt),sStack_20 - end_excerpt);
          bc_trie_insert(pbStack_68,"RAW_CONTENT",content);
          description = (char *)0x0;
          endl = (char *)0x0;
          headers = (bc_slist_t *)0x0;
          pbStack_90 = (bc_slist_t *)0x0;
          pvVar5 = bc_trie_lookup(pbStack_68,"TOCTREE");
          maxdepth._7_1_ = pvVar5 == (void *)0x0;
          if ((bool)maxdepth._7_1_) {
            local_e8 = &stack0xffffffffffffff70;
          }
          else {
            local_e8 = (bc_slist_t **)0x0;
          }
          rv = (bc_trie_t *)
               blogc_content_parse(content,(size_t *)&key,&description,&endl,(char **)&headers,
                                   local_e8);
          if (description != (char *)0x0) {
            pvVar5 = bc_trie_lookup(pbStack_68,"FIRST_HEADER");
            if (pvVar5 == (void *)0x0) {
              bc_trie_insert(pbStack_68,"FIRST_HEADER",description);
            }
            else {
              free(description);
            }
          }
          if (endl != (char *)0x0) {
            pvVar5 = bc_trie_lookup(pbStack_68,"DESCRIPTION");
            if (pvVar5 == (void *)0x0) {
              bc_trie_insert(pbStack_68,"DESCRIPTION",endl);
            }
            else {
              free(endl);
            }
          }
          if (pbStack_90 != (bc_slist_t *)0x0) {
            endptr = (char *)bc_trie_lookup(pbStack_68,"TOCTREE_MAXDEPTH");
            if (endptr != (char *)0x0) {
              lVar6 = strtol(endptr,&toctree,10);
              err_local._4_4_ = (int)lVar6;
              if ((*endptr != '\0') && (*toctree != '\0')) {
                pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,
                                         start,
                                         "Invalid value for \'TOCTREE_MAXDEPTH\' variable: %s.",
                                         endptr);
                *(bc_error_t **)current = pbVar3;
                blogc_toctree_free(pbStack_90);
                free(headers);
                free(rv);
                break;
              }
            }
            pcVar7 = blogc_toctree_render(pbStack_90,err_local._4_4_,(char *)headers);
            blogc_toctree_free(pbStack_90);
            if (pcVar7 != (char *)0x0) {
              bc_trie_insert(pbStack_68,"TOCTREE",pcVar7);
            }
          }
          free(headers);
          bc_trie_insert(pbStack_68,"CONTENT",rv);
          pbVar1 = pbStack_68;
          if (key == (char *)0x0) {
            local_f8 = bc_strdup((char *)rv);
          }
          else {
            local_f8 = bc_strndup((char *)rv,(size_t)key);
          }
          bc_trie_insert(pbVar1,"EXCERPT",local_f8);
        }
      }
      if (*(long *)current != 0) break;
    }
    if ((*(long *)current == 0) && (sVar8 = bc_trie_size(pbStack_68), sVar8 == 0)) {
      switch(first_header._4_4_) {
      case 1:
        pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,start,
                                 "Your source file is empty.");
        *(bc_error_t **)current = pbVar3;
        break;
      case 2:
        pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,start,
                                 "Your last configuration key is missing \':\' and the value");
        *(bc_error_t **)current = pbVar3;
        break;
      case 3:
        pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,start,
                                 "Configuration value not provided for \'%s\'.",tmp);
        *(bc_error_t **)current = pbVar3;
        break;
      case 4:
        pbVar3 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,(char *)src_len_local,sStack_20,start,
                                 "No line ending after the configuration value for \'%s\'.",tmp);
        *(bc_error_t **)current = pbVar3;
        break;
      case 5:
      case 6:
      case 7:
      }
    }
    if (*(long *)current == 0) {
      src_local = (char *)pbStack_68;
    }
    else {
      free(tmp);
      bc_trie_free(pbStack_68);
      src_local = (char *)0x0;
    }
  }
  return (bc_trie_t *)src_local;
}

Assistant:

bc_trie_t*
blogc_source_parse(const char *src, size_t src_len, int toctree_maxdepth,
    bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end_excerpt = 0;

    char *key = NULL;
    char *tmp = NULL;
    char *content = NULL;
    bc_trie_t *rv = bc_trie_new(free);

    blogc_source_parser_state_t state = SOURCE_START;

    while (current < src_len) {
        char c = src[current];

        switch (state) {

            case SOURCE_START:
                if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = SOURCE_CONFIG_KEY;
                    start = current;
                    break;
                }
                if (c == '-') {
                    state = SOURCE_SEPARATOR;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Can't find a configuration key or the content separator.");
                break;

            case SOURCE_CONFIG_KEY:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (c == ':') {
                    key = bc_strndup(src + start, current - start);
                    if (((current - start == 8) &&
                         (0 == strncmp("FILENAME", src + start, 8))) ||
                        ((current - start == 7) &&
                         (0 == strncmp("CONTENT", src + start, 7))) ||
                        ((current - start == 14) &&
                         (0 == strncmp("DATE_FORMATTED", src + start, 14))) ||
                        ((current - start == 20) &&
                         (0 == strncmp("DATE_FIRST_FORMATTED", src + start, 20))) ||
                        ((current - start == 19) &&
                         (0 == strncmp("DATE_LAST_FORMATTED", src + start, 19))) ||
                        ((current - start == 10) &&
                         (0 == strncmp("PAGE_FIRST", src + start, 10))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("PAGE_PREVIOUS", src + start, 13))) ||
                        ((current - start == 12) &&
                         (0 == strncmp("PAGE_CURRENT", src + start, 12))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_NEXT", src + start, 9))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_LAST", src + start, 9))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("BLOGC_VERSION", src + start, 13))))
                    {
                        *err = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                            "'%s' variable is forbidden in source files. It will "
                            "be set for you by the compiler.", key);
                        break;
                    }
                    state = SOURCE_CONFIG_VALUE_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Invalid configuration key.");
                break;

            case SOURCE_CONFIG_VALUE_START:
                if (c != '\n' && c != '\r') {
                    state = SOURCE_CONFIG_VALUE;
                    start = current;
                    break;
                }
                bc_trie_insert(rv, key, bc_strdup(""));
                free(key);
                key = NULL;
                state = SOURCE_START;
                break;

            case SOURCE_CONFIG_VALUE:
                if (c == '\n' || c == '\r') {
                    tmp = bc_strndup(src + start, current - start);
                    bc_trie_insert(rv, key, bc_strdup(bc_str_strip(tmp)));
                    free(tmp);
                    free(key);
                    key = NULL;
                    state = SOURCE_START;
                }
                break;

            case SOURCE_SEPARATOR:
                if (c == '-')
                    break;
                if (c == '\n' || c == '\r') {
                    state = SOURCE_CONTENT_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Invalid content separator. Must be more than one '-' characters.");
                break;

            case SOURCE_CONTENT_START:
                if (c == '\n' || c == '\r')
                    break;
                start = current;
                state = SOURCE_CONTENT;
                break;

            case SOURCE_CONTENT:
                if (current == (src_len - 1)) {
                    tmp = bc_strndup(src + start, src_len - start);
                    bc_trie_insert(rv, "RAW_CONTENT", tmp);
                    char *first_header = NULL;
                    char *description = NULL;
                    char *endl = NULL;
                    bc_slist_t *headers = NULL;
                    bool read_headers = (NULL == bc_trie_lookup(rv, "TOCTREE"));
                    content = blogc_content_parse(tmp, &end_excerpt,
                        &first_header, &description, &endl, read_headers ? &headers : NULL);
                    if (first_header != NULL) {
                        // do not override source-provided first_header.
                        if (NULL == bc_trie_lookup(rv, "FIRST_HEADER")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "FIRST_HEADER", first_header);
                        }
                        else {
                            free(first_header);
                        }
                    }
                    if (description != NULL) {
                        // do not override source-provided description.
                        if (NULL == bc_trie_lookup(rv, "DESCRIPTION")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "DESCRIPTION", description);
                        }
                        else {
                            free(description);
                        }
                    }
                    if (headers != NULL) {
                        // we already validated that the user do not defined TOCTREE
                        // manually in source file.
                        const char *maxdepth = bc_trie_lookup(rv, "TOCTREE_MAXDEPTH");
                        if (maxdepth != NULL) {
                            char *endptr;
                            toctree_maxdepth = strtol(maxdepth, &endptr, 10);
                            if (*maxdepth != '\0' && *endptr != '\0') {
                                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                                    current,
                                    "Invalid value for 'TOCTREE_MAXDEPTH' variable: %s.",
                                    maxdepth);
                                blogc_toctree_free(headers);
                                free(endl);
                                free(content);
                                break;
                            }
                        }
                        char *toctree = blogc_toctree_render(headers, toctree_maxdepth, endl);
                        blogc_toctree_free(headers);
                        if (toctree != NULL) {
                            bc_trie_insert(rv, "TOCTREE", toctree);
                        }
                    }
                    free(endl);
                    bc_trie_insert(rv, "CONTENT", content);
                    bc_trie_insert(rv, "EXCERPT", end_excerpt == 0 ?
                        bc_strdup(content) : bc_strndup(content, end_excerpt));
                }
                break;
        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL && bc_trie_size(rv) == 0) {

        // ok, nothing found in the config trie, but no error set either.
        // let's try to be nice with the users and provide some reasonable
        // output. :)
        switch (state) {
            case SOURCE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your source file is empty.");
                break;
            case SOURCE_CONFIG_KEY:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your last configuration key is missing ':' and "
                    "the value");
                break;
            case SOURCE_CONFIG_VALUE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Configuration value not provided for '%s'.",
                    key);
                break;
            case SOURCE_CONFIG_VALUE:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "No line ending after the configuration value for "
                    "'%s'.", key);
                break;
            case SOURCE_SEPARATOR:
            case SOURCE_CONTENT_START:
            case SOURCE_CONTENT:
                break;  // won't happen, and if even happen, shouldn't be fatal
        }
    }

    if (*err != NULL) {
        free(key);
        bc_trie_free(rv);
        return NULL;
    }

    return rv;
}